

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r,int a)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = (ulong)(uint)a;
  secp256k1_fe_verify(r);
  iVar2 = r->magnitude * a;
  if (iVar2 < 0x21) {
    r->n[0] = r->n[0] * uVar1;
    r->n[1] = r->n[1] * uVar1;
    r->n[2] = r->n[2] * uVar1;
    r->n[3] = r->n[3] * uVar1;
    r->n[4] = uVar1 * r->n[4];
    r->magnitude = iVar2;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/field_impl.h"
          ,0x13a,"test condition failed: a*r->magnitude <= 32");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r, int a) {
    SECP256K1_FE_VERIFY(r);

    VERIFY_CHECK(a >= 0 && a <= 32);
    VERIFY_CHECK(a*r->magnitude <= 32);
    secp256k1_fe_impl_mul_int_unchecked(r, a);
    r->magnitude *= a;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}